

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warrior.c
# Opt level: O3

void do_specialize(CHAR_DATA *ch,char *argument)

{
  short *psVar1;
  long *plVar2;
  ulong uVar3;
  PC_DATA *pPVar4;
  bool bVar5;
  int iVar6;
  CClass *this;
  ulong uVar7;
  short sVar8;
  int iVar9;
  char *txt;
  long lVar10;
  double dVar11;
  char buf [4608];
  char acStack_1238 [4616];
  
  bVar5 = is_npc(ch);
  if (bVar5) {
    return;
  }
  this = ch->my_class;
  if ((this == (CClass *)0x0) &&
     ((ch->pIndexData == (MOB_INDEX_DATA *)0x0 ||
      (this = ch->pIndexData->my_class, this == (CClass *)0x0)))) {
    this = CClass::GetClass(0);
  }
  iVar6 = CClass::GetIndex(this);
  if (iVar6 == 1) {
    bVar5 = str_cmp(argument,"");
    if (!bVar5) {
      send_to_char("You can choose from the following specializations:\n\r",ch);
      lVar10 = 0x18;
      do {
        uVar3 = *(ulong *)((long)&sphere_table[0x12].name + lVar10);
        uVar7 = uVar3 + 0x1f;
        if (-1 < (long)uVar3) {
          uVar7 = uVar3;
        }
        uVar7 = ch->pcdata->styles[(int)(uVar7 >> 5)];
        dVar11 = exp2((double)((long)uVar3 % 0x20));
        if ((uVar7 & (long)dVar11) == 0) {
          send_to_char(*(char **)((long)&style_table[0].bit + lVar10),ch);
          send_to_char("\n\r",ch);
        }
        lVar10 = lVar10 + 0x10;
      } while (lVar10 != 0x78);
      return;
    }
    if (ch->pcdata->special == 0) {
      txt = "You have no available specializations.\n\r";
    }
    else {
      sVar8 = 1;
      lVar10 = 0x18;
      do {
        bVar5 = str_prefix(argument,*(char **)((long)&style_table[0].bit + lVar10));
        if (!bVar5) {
          dVar11 = exp2((double)(*(long *)((long)&sphere_table[0x12].name + lVar10) % 0x20));
          pPVar4 = ch->pcdata;
          iVar6 = *(int *)((long)&sphere_table[0x12].name + lVar10);
          iVar9 = iVar6 + 0x1f;
          if (-1 < iVar6) {
            iVar9 = iVar6;
          }
          plVar2 = pPVar4->styles + (iVar9 >> 5);
          *plVar2 = *plVar2 | (long)dVar11;
          psVar1 = &pPVar4->special;
          *psVar1 = *psVar1 + -1;
          sprintf(acStack_1238,"You are now specialized in the %s fighting style.\n\r",
                  *(undefined8 *)((long)&style_table[0].bit + lVar10));
          send_to_char(acStack_1238,ch);
          group_add(ch,*(char **)((long)&style_table[0].bit + lVar10),false);
          pPVar4 = ch->pcdata;
          iVar6 = skill_lookup(*(char **)((long)&style_table[0].bit + lVar10));
          pPVar4->learned[iVar6] = 2;
          if (ch->pcdata->style != 0) {
            return;
          }
          ch->pcdata->style = sVar8;
          return;
        }
        sVar8 = sVar8 + 1;
        lVar10 = lVar10 + 0x10;
      } while (lVar10 != 0x78);
      txt = "That\'s not a valid style to specialize in.\n\r";
    }
  }
  else {
    txt = "Huh?\n\r";
  }
  send_to_char(txt,ch);
  return;
}

Assistant:

void do_specialize(CHAR_DATA *ch, char *argument)
{
	int i, style = 0;
	char buf[MSL];

	if (is_npc(ch))
		return;

	if (ch->Class()->GetIndex() != CLASS_WARRIOR)
	{
		send_to_char("Huh?\n\r", ch);
		return;
	}

	if (!str_cmp(argument, ""))
	{
		send_to_char("You can choose from the following specializations:\n\r", ch);

		for (i = 1; i < MAX_STYLE; i++)
		{
			if (!IS_SET(ch->pcdata->styles, style_table[i].bit))
			{
				send_to_char(style_table[i].name, ch);
				send_to_char("\n\r", ch);
			}
		}

		return;
	}

	if (!ch->pcdata->special)
	{
		send_to_char("You have no available specializations.\n\r", ch);
		return;
	}

	style = style_lookup(argument);

	if (!style)
	{
		send_to_char("That's not a valid style to specialize in.\n\r", ch);
		return;
	}

	SET_BIT(ch->pcdata->styles, style_table[style].bit);
	ch->pcdata->special--;

	sprintf(buf, "You are now specialized in the %s fighting style.\n\r", style_table[style].name);
	send_to_char(buf, ch);

	group_add(ch, style_table[style].name, false);

	ch->pcdata->learned[skill_lookup(style_table[style].name)] = 2;

	if (ch->pcdata->style == 0)
		ch->pcdata->style = style;
}